

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

bool __thiscall HEkkPrimal::useVariableIn(HEkkPrimal *this)

{
  HighsInt *pHVar1;
  double updated_dual;
  double dVar2;
  HEkk *this_00;
  double computed_dual;
  string theta_dual_size;
  string theta_dual_sign;
  
  this_00 = this->ekk_instance_;
  updated_dual = (this_00->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[this->variable_in];
  this->move_in = ((updated_dual <= 0.0) - 1) + (uint)(updated_dual <= 0.0);
  HEkk::pivotColumnFtran(this_00,this->variable_in,&this->col_aq);
  computed_dual =
       HEkk::computeDualForTableauColumn(this->ekk_instance_,this->variable_in,&this->col_aq);
  HEkk::debugUpdatedDual(this->ekk_instance_,updated_dual,computed_dual);
  (this_00->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[this->variable_in] = computed_dual;
  this->theta_dual = computed_dual;
  dVar2 = this->dual_feasibility_tolerance;
  if (dVar2 < ABS(computed_dual)) {
    if (0.0 < updated_dual * computed_dual) {
      return true;
    }
    theta_dual_size._M_dataplus._M_p = (pointer)&theta_dual_size.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&theta_dual_size,"");
  }
  else {
    pHVar1 = &(this->ekk_instance_->info_).num_dual_infeasibilities;
    *pHVar1 = *pHVar1 + -1;
    theta_dual_size._M_dataplus._M_p = (pointer)&theta_dual_size.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&theta_dual_size);
    std::__cxx11::string::_M_replace
              ((ulong)&theta_dual_size,0,(char *)theta_dual_size._M_string_length,0x3d646d);
  }
  theta_dual_sign._M_dataplus._M_p = (pointer)&theta_dual_sign.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&theta_dual_sign);
  if (updated_dual * computed_dual <= 0.0) {
    std::__cxx11::string::_M_replace
              ((ulong)&theta_dual_sign,0,(char *)theta_dual_sign._M_string_length,0x3d6479);
  }
  highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kInfo,
              "Chosen entering variable %d (Iter = %d; Update = %d) has computed (updated) dual of %10.4g (%10.4g) so don\'t use it%s%s\n"
              ,computed_dual,updated_dual,(ulong)(uint)this->variable_in,
              (ulong)(uint)this->ekk_instance_->iteration_count_,
              (ulong)(uint)(this_00->info_).update_count,theta_dual_size._M_dataplus._M_p,
              theta_dual_sign._M_dataplus._M_p);
  if ((dVar2 < ABS(computed_dual)) && (0 < (this_00->info_).update_count)) {
    this->rebuild_reason = 7;
  }
  this->initialise_hyper_chuzc = this->use_hyper_chuzc;
  this->max_hyper_chuzc_non_candidate_measure = -1.0;
  this->done_next_chuzc = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)theta_dual_sign._M_dataplus._M_p != &theta_dual_sign.field_2) {
    operator_delete(theta_dual_sign._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)theta_dual_size._M_dataplus._M_p != &theta_dual_size.field_2) {
    operator_delete(theta_dual_size._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool HEkkPrimal::useVariableIn() {
  // rebuild_reason = kRebuildReasonPossiblySingularBasis is set if
  // numerical trouble is detected
  HighsSimplexInfo& info = ekk_instance_.info_;
  vector<double>& workDual = info.workDual_;
  const vector<int8_t>& nonbasicMove = ekk_instance_.basis_.nonbasicMove_;
  const double updated_theta_dual = workDual[variable_in];
  // Determine the move direction - can't use nonbasicMove_[variable_in]
  // due to free columns
  move_in = updated_theta_dual > 0 ? -1 : 1;
  // Unless the variable is free, nonbasicMove[variable_in] should be the same
  // as move_in
  if (nonbasicMove[variable_in]) assert(nonbasicMove[variable_in] == move_in);
  //
  // FTRAN
  //
  // Compute pivot column
  ekk_instance_.pivotColumnFtran(variable_in, col_aq);
  // Compute the dual for the pivot column and compare it with the
  // updated value
  double computed_theta_dual =
      ekk_instance_.computeDualForTableauColumn(variable_in, col_aq);
  ekk_instance_.debugUpdatedDual(updated_theta_dual, computed_theta_dual);
  // Feed in the computed dual value.
  //
  // The sum of dual infeasibilities (and maybe max dual
  // infeasibility) will be wrong, but there's a big tolerance on
  // this in debugSimplex. Have to be careful (below) if the computed
  // dual value is no longer a dual infeasibility
  info.workDual_[variable_in] = computed_theta_dual;
  // Reassign theta_dual to be the computed value
  theta_dual = info.workDual_[variable_in];
  // Determine whether theta_dual is too small or has changed sign
  const bool theta_dual_small = fabs(theta_dual) <= dual_feasibility_tolerance;
  const bool theta_dual_sign_error =
      updated_theta_dual * computed_theta_dual <= 0;

  // If theta_dual is small, then it's no longer a dual infeasibility,
  // so reduce the number of dual infeasibilities. Otherwise an error
  // is identified in debugSimplex
  if (theta_dual_small) ekk_instance_.info_.num_dual_infeasibilities--;
  if (theta_dual_small || theta_dual_sign_error) {
    // The computed dual is small or has a sign error, so don't use it
    std::string theta_dual_size = "";
    if (theta_dual_small) theta_dual_size = "; too small";
    std::string theta_dual_sign = "";
    if (theta_dual_sign_error) theta_dual_sign = "; sign error";
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "Chosen entering variable %" HIGHSINT_FORMAT
                " (Iter = %" HIGHSINT_FORMAT "; Update = %" HIGHSINT_FORMAT
                ") has computed "
                "(updated) dual of %10.4g (%10.4g) so don't use it%s%s\n",
                variable_in, ekk_instance_.iteration_count_, info.update_count,
                computed_theta_dual, updated_theta_dual,
                theta_dual_size.c_str(), theta_dual_sign.c_str());
    // If a significant computed dual has sign error, consider reinverting
    if (!theta_dual_small && info.update_count > 0)
      rebuild_reason = kRebuildReasonPossiblySingularBasis;
    hyperChooseColumnClear();
    return false;
  }
  return true;
}